

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

void ma_context_get_device_info_source_callback__pulse
               (ma_pa_context *pPulseContext,ma_pa_source_info *pInfo,wchar_t endOfList,
               void *pUserData)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  undefined4 uVar5;
  long lVar6;
  
  if (endOfList < L'\x01') {
    if (pUserData == (void *)0x0) {
      __assert_fail("pData != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                    ,0x4565,
                    "void ma_context_get_device_info_source_callback__pulse(ma_pa_context *, const ma_pa_source_info *, int, void *)"
                   );
    }
    *(undefined4 *)((long)pUserData + 0xc) = 1;
    pcVar2 = pInfo->name;
    if ((pcVar2 != (char *)0x0) && (lVar3 = *pUserData, lVar3 != 0)) {
      lVar6 = 0;
      do {
        cVar1 = pcVar2[lVar6];
        if (cVar1 == '\0') goto LAB_001a9c57;
        *(char *)(lVar3 + lVar6) = cVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0xff);
      lVar6 = 0xff;
LAB_001a9c57:
      *(undefined1 *)(lVar3 + lVar6) = 0;
    }
    pcVar2 = pInfo->description;
    if (pcVar2 != (char *)0x0) {
      lVar3 = *pUserData;
      lVar6 = 0;
      do {
        cVar1 = pcVar2[lVar6];
        if (cVar1 == '\0') goto LAB_001a9c8b;
        *(char *)(lVar3 + 0x100 + lVar6) = cVar1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0xff);
      lVar6 = 0xff;
LAB_001a9c8b:
      *(undefined1 *)(lVar3 + 0x100 + lVar6) = 0;
    }
    uVar4 = (ulong)(uint)(pInfo->sample_spec).format;
    uVar5 = 0;
    if (uVar4 < 10) {
      uVar5 = *(undefined4 *)(&DAT_001bf2cc + uVar4 * 4);
    }
    lVar3 = *pUserData;
    *(undefined4 *)(lVar3 + 0x208) = uVar5;
    *(uint *)(lVar3 + 0x20c) = (uint)(pInfo->sample_spec).channels;
    *(ma_uint32 *)(lVar3 + 0x210) = (pInfo->sample_spec).rate;
    *(undefined4 *)(lVar3 + 0x214) = 0;
    *(undefined4 *)(lVar3 + 0x204) = 1;
    if (*(ma_uint32 *)((long)pUserData + 8) == pInfo->index) {
      *(undefined4 *)(lVar3 + 0x200) = 1;
    }
  }
  return;
}

Assistant:

static void ma_context_get_device_info_source_callback__pulse(ma_pa_context* pPulseContext, const ma_pa_source_info* pInfo, int endOfList, void* pUserData)
{
    ma_context_get_device_info_callback_data__pulse* pData = (ma_context_get_device_info_callback_data__pulse*)pUserData;

    if (endOfList > 0) {
        return;
    }

    MA_ASSERT(pData != NULL);
    pData->foundDevice = MA_TRUE;

    if (pInfo->name != NULL) {
        ma_strncpy_s(pData->pDeviceInfo->id.pulse, sizeof(pData->pDeviceInfo->id.pulse), pInfo->name, (size_t)-1);
    }

    if (pInfo->description != NULL) {
        ma_strncpy_s(pData->pDeviceInfo->name, sizeof(pData->pDeviceInfo->name), pInfo->description, (size_t)-1);
    }

    /*
    We're just reporting a single data format here. I think technically PulseAudio might support
    all formats, but I don't trust that PulseAudio will do *anything* right, so I'm just going to
    report the "native" device format.
    */
    pData->pDeviceInfo->nativeDataFormats[0].format     = ma_format_from_pulse(pInfo->sample_spec.format);
    pData->pDeviceInfo->nativeDataFormats[0].channels   = pInfo->sample_spec.channels;
    pData->pDeviceInfo->nativeDataFormats[0].sampleRate = pInfo->sample_spec.rate;
    pData->pDeviceInfo->nativeDataFormats[0].flags      = 0;
    pData->pDeviceInfo->nativeDataFormatCount = 1;

    if (pData->defaultDeviceIndex == pInfo->index) {
        pData->pDeviceInfo->isDefault = MA_TRUE;
    }

    (void)pPulseContext; /* Unused. */
}